

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::StringOption::reset(StringOption *this)

{
  char *pcVar1;
  pointer pcVar2;
  string *psVar3;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  psVar3 = this->value;
  pcVar1 = this->defaultValue;
  if (pcVar1 == (char *)0x0) {
    if (psVar3 != (string *)0x0) {
      pcVar2 = (psVar3->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar3->field_2) {
        operator_delete(pcVar2);
      }
      operator_delete(psVar3);
      this->value = (string *)0x0;
    }
  }
  else if (psVar3 == (string *)0x0) {
    psVar3 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)psVar3,pcVar1,(allocator *)local_38);
    this->value = psVar3;
  }
  else {
    std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
    std::__cxx11::string::operator=((string *)this->value,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return;
}

Assistant:

virtual void reset()
    {
        if (defaultValue == NULL) {
            if (value != NULL) {
                delete value;
                value = NULL;
            }
        } else {
            if (value != NULL) {
                *value = std::string(defaultValue);
            } else {
                value = new std::string(defaultValue);
            }
        }
    }